

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

settings_pack *
libtorrent::load_pack_from_dict(settings_pack *__return_storage_ptr__,bdecode_node *settings)

{
  char *pcVar1;
  size_t __n;
  char *__s1;
  int iVar2;
  type_t tVar3;
  int iVar4;
  size_t sVar5;
  int64_t iVar6;
  size_type __rlen_2;
  size_type __rlen;
  int i;
  long lVar7;
  undefined8 *puVar8;
  string_view sVar9;
  string local_a8;
  bdecode_node *local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  (__return_storage_ptr__->super_settings_interface)._vptr_settings_interface =
       (_func_int **)&PTR_set_str_004e5260;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_strings).
  super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_ints).
  super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_bools).
  super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  i = 0;
  local_88 = settings;
  do {
    iVar2 = bdecode_node::dict_size(settings);
    if (iVar2 <= i) {
      return __return_storage_ptr__;
    }
    bdecode_node::dict_at(&local_80,settings,i);
    tVar3 = bdecode_node::type(&local_80.second);
    __s1 = local_80.first._M_str;
    __n = local_80.first._M_len;
    if (tVar3 == string_t) {
      puVar8 = &(anonymous_namespace)::str_settings;
      lVar7 = 0;
      do {
        pcVar1 = (char *)*puVar8;
        sVar5 = strlen(pcVar1);
        if ((__n == sVar5) && ((__n == 0 || (iVar2 = bcmp(__s1,pcVar1,__n), iVar2 == 0)))) {
          sVar9 = bdecode_node::string_value(&local_80.second);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,sVar9._M_str,sVar9._M_str + sVar9._M_len);
          settings_pack::set_str(__return_storage_ptr__,(int)lVar7,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        lVar7 = lVar7 + 1;
        puVar8 = puVar8 + 7;
      } while (lVar7 != 0xd);
    }
    else if (tVar3 == int_t) {
      iVar2 = 0x4000;
      lVar7 = 0;
      do {
        pcVar1 = *(char **)((long)&(anonymous_namespace)::int_settings + lVar7);
        sVar5 = strlen(pcVar1);
        if ((__n == sVar5) && ((__n == 0 || (iVar4 = bcmp(__s1,pcVar1,__n), iVar4 == 0)))) {
          iVar6 = bdecode_node::int_value(&local_80.second);
          settings_pack::set_int(__return_storage_ptr__,iVar2,(int)iVar6);
          goto LAB_002f5721;
        }
        iVar2 = iVar2 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x13e0);
      iVar2 = 0x8000;
      lVar7 = 0;
      do {
        pcVar1 = *(char **)((long)&(anonymous_namespace)::bool_settings + lVar7);
        sVar5 = strlen(pcVar1);
        if ((__n == sVar5) && ((__n == 0 || (iVar4 = bcmp(__s1,pcVar1,__n), iVar4 == 0)))) {
          iVar6 = bdecode_node::int_value(&local_80.second);
          settings_pack::set_bool(__return_storage_ptr__,iVar2,iVar6 != 0);
          break;
        }
        iVar2 = iVar2 + 1;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0xa80);
    }
LAB_002f5721:
    settings = local_88;
    if (local_80.second.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.second.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    i = i + 1;
  } while( true );
}

Assistant:

settings_pack load_pack_from_dict(bdecode_node const& settings)
	{
		settings_pack pack;

		for (int i = 0; i < settings.dict_size(); ++i)
		{
			auto const [key, val] = settings.dict_at(i);
			switch (val.type())
			{
				case bdecode_node::dict_t:
				case bdecode_node::list_t:
					continue;
				case bdecode_node::int_t:
				{
					bool found = false;
					for (int k = 0; k < int_settings.end_index(); ++k)
					{
						if (key != int_settings[k].name) continue;
						pack.set_int(settings_pack::int_type_base | k, int(val.int_value()));
						found = true;
						break;
					}
					if (found) continue;
					for (int k = 0; k < bool_settings.end_index(); ++k)
					{
						if (key != bool_settings[k].name) continue;
						pack.set_bool(settings_pack::bool_type_base | k, val.int_value() != 0);
						break;
					}
				}
				break;
			case bdecode_node::string_t:
				for (int k = 0; k < str_settings.end_index(); ++k)
				{
					if (key != str_settings[k].name) continue;
					pack.set_str(settings_pack::string_type_base + k, std::string(val.string_value()));
					break;
				}
				break;
			case bdecode_node::none_t:
				break;
			}
		}
		return pack;
	}